

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O2

void __thiscall cppcms::widgets::select_base::element::element(element *this,element *other)

{
  uint uVar1;
  
  uVar1 = *(uint *)other;
  *(uint *)this = *(uint *)this & 0xfffffffe | uVar1 & 1;
  *(uint *)this = *(uint *)other & 0xfffffffe | uVar1 & 1;
  std::__cxx11::string::string((string *)&this->id,(string *)&other->id);
  std::__cxx11::string::string((string *)&this->str_option,(string *)&other->str_option);
  booster::locale::basic_message<char>::basic_message(&this->tr_option,&other->tr_option);
  (this->d).ptr_ = (_data *)0x0;
  return;
}

Assistant:

select_base::element::element(select_base::element const &other) : 
	need_translation(other.need_translation),
	reserved(other.reserved),
	id(other.id),
	str_option(other.str_option),
	tr_option(other.tr_option)
{
}